

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lexer.cpp
# Opt level: O2

void test_get_regex_literal(wstring_view text)

{
  bool bVar1;
  version v;
  wostream *pwVar2;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar3;
  __type_identity_t<basic_string_view<wchar_t,_char_traits<wchar_t>_>_> __y;
  wstring _r;
  wstring local_38;
  
  get_one_regexp_literal_abi_cxx11_(&local_38,text);
  __y._M_str = local_38._M_dataplus._M_p;
  __y._M_len = local_38._M_string_length;
  bVar1 = std::operator!=(text,__y);
  if (!bVar1) {
    std::__cxx11::wstring::~wstring((wstring *)&local_38);
    return;
  }
  pwVar2 = std::operator<<((wostream *)&std::wcerr,"test_get_regex_literal");
  pwVar2 = std::operator<<(pwVar2," in ");
  pwVar2 = std::operator<<(pwVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                          );
  pwVar2 = std::operator<<(pwVar2,":");
  pwVar2 = (wostream *)std::wostream::operator<<((wostream *)pwVar2,0x8f);
  pwVar2 = std::operator<<(pwVar2,":\n");
  pwVar2 = std::operator<<(pwVar2,"text");
  pwVar2 = std::operator<<(pwVar2," != ");
  pwVar2 = std::operator<<(pwVar2,"get_one_regexp_literal(text)");
  pwVar2 = std::operator<<(pwVar2,"\n");
  pwVar2 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar2,text._M_str,text._M_len);
  pwVar2 = std::operator<<(pwVar2," != ");
  pwVar2 = std::operator<<(pwVar2,(wstring *)&local_38);
  pwVar2 = std::operator<<(pwVar2,"\n");
  v = tested_version();
  pbVar3 = mjs::operator<<(pwVar2,v);
  std::operator<<(pbVar3,"\n");
  abort();
}

Assistant:

void test_get_regex_literal(std::wstring_view text) {
    REQUIRE_EQ(text, get_one_regexp_literal(text));
}